

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<char_const(&)[62],kj::StringPtr,char_const(&)[92],kj::StringTree,char_const(&)[131],int,char_const(&)[152],kj::Array<kj::StringTree>,char_const(&)[61],kj::Array<kj::StringTree>,char_const(&)[49],kj::Array<kj::StringTree>,char_const(&)[2],kj::Array<kj::StringTree>,kj::String&,char_const(&)[2],kj::Array<kj::StringTree>,kj::String&,char_const(&)[2],kj::Array<kj::StringTree>,kj::Array<kj::StringTree>,char_const(&)[20]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [62],StringPtr *params_1,
          char (*params_2) [92],StringTree *params_3,char (*params_4) [131],int *params_5,
          char (*params_6) [152],Array<kj::StringTree> *params_7,char (*params_8) [61],
          Array<kj::StringTree> *params_9,char (*params_10) [49],Array<kj::StringTree> *params_11,
          char (*params_12) [2],Array<kj::StringTree> *params_13,String *params_14,
          char (*params_15) [2],Array<kj::StringTree> *params_16,String *params_17,
          char (*params_18) [2],Array<kj::StringTree> *params_19,Array<kj::StringTree> *params_20,
          char (*params_21) [20])

{
  Branch *pBVar1;
  StringTree *pSVar2;
  ArrayPtr<const_char> *params_21_00;
  ArrayPtr<const_char> local_2a0;
  undefined1 local_290 [16];
  ArrayPtr<const_char> local_280;
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  ArrayPtr<const_char> local_210;
  ArrayPtr<const_char> local_200;
  ArrayPtr<const_char> local_1f0;
  CappedArray<char,_14UL> local_1e0;
  StringTree local_1c8;
  StringTree local_190;
  StringTree local_158;
  StringTree local_120;
  StringTree local_e8;
  ArrayPtr<const_char> local_b0;
  StringTree local_a0;
  StringTree local_68;
  
  local_1f0 = toCharSequence<char_const(&)[62]>((char (*) [62])this);
  local_200.ptr = *(char **)*params;
  local_200.size_ = *(long *)(*params + 8) - 1;
  local_210 = toCharSequence<char_const(&)[92]>((char (*) [92])params_1);
  local_220 = (undefined1  [16])toCharSequence<char_const(&)[131]>((char (*) [131])params_3);
  toCharSequence<int>(&local_1e0,(int *)params_4);
  local_230 = (undefined1  [16])toCharSequence<char_const(&)[152]>((char (*) [152])params_5);
  operator*(&local_e8,params_6);
  local_240 = (undefined1  [16])toCharSequence<char_const(&)[61]>((char (*) [61])params_7);
  operator*(&local_120,params_8);
  local_250 = (undefined1  [16])toCharSequence<char_const(&)[49]>((char (*) [49])params_9);
  operator*(&local_158,params_10);
  local_260 = (undefined1  [16])toCharSequence<char_const(&)[2]>((char (*) [2])params_11);
  operator*(&local_190,params_12);
  pBVar1 = (Branch *)params_13->size_;
  local_270._0_8_ = pBVar1;
  if (pBVar1 != (Branch *)0x0) {
    local_270._0_8_ = params_13->ptr;
  }
  local_270._8_8_ = (char *)0x0;
  if (pBVar1 != (Branch *)0x0) {
    local_270._8_8_ = (char *)((long)&pBVar1[-1].content.branches.disposer + 7);
  }
  local_280 = toCharSequence<char_const(&)[2]>((char (*) [2])params_14);
  operator*(&local_1c8,params_15);
  pSVar2 = (StringTree *)params_16->size_;
  local_290._0_8_ = pSVar2;
  if (pSVar2 != (StringTree *)0x0) {
    local_290._0_8_ = params_16->ptr;
  }
  local_290._8_8_ = (char *)0x0;
  if (pSVar2 != (StringTree *)0x0) {
    local_290._8_8_ = (char *)((long)&pSVar2[-1].branches.disposer + 7);
  }
  local_2a0 = toCharSequence<char_const(&)[2]>((char (*) [2])params_17);
  operator*(&local_68,params_18);
  operator*(&local_a0,params_19);
  params_21_00 = (ArrayPtr<const_char> *)0x127cfd;
  local_b0 = toCharSequence<char_const(&)[20]>((char (*) [20])params_20);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_1f0,&local_200,&local_210,
             (ArrayPtr<const_char> *)params_2,(StringTree *)local_220,
             (ArrayPtr<const_char> *)&local_1e0,(CappedArray<char,_14UL> *)local_230,
             (ArrayPtr<const_char> *)&local_e8,(StringTree *)local_240,
             (ArrayPtr<const_char> *)&local_120,(StringTree *)local_250,
             (ArrayPtr<const_char> *)&local_158,(StringTree *)local_260,
             (ArrayPtr<const_char> *)&local_190,(StringTree *)local_270,&local_280,
             (ArrayPtr<const_char> *)&local_1c8,(StringTree *)local_290,&local_2a0,
             (ArrayPtr<const_char> *)&local_68,&local_a0,(StringTree *)&local_b0,params_21_00);
  StringTree::~StringTree(&local_a0);
  StringTree::~StringTree(&local_68);
  StringTree::~StringTree(&local_1c8);
  StringTree::~StringTree(&local_190);
  StringTree::~StringTree(&local_158);
  StringTree::~StringTree(&local_120);
  StringTree::~StringTree(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}